

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::MultisampleShadeCountRenderCase::verifyImage
          (MultisampleShadeCountRenderCase *this,Surface *resultImage)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RenderTarget *this_00;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  mapped_type_conflict *pmVar7;
  pointer ppVar8;
  size_type sVar9;
  int local_658;
  bool local_652;
  bool local_651;
  MessageBuilder local_640;
  int local_4c0;
  int local_4bc;
  MessageBuilder local_4b8;
  iterator local_338;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_> local_330;
  iterator local_328;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_> local_320;
  const_iterator it;
  _Self local_310;
  key_type local_308;
  RGBA local_304;
  deUint32 packed;
  RGBA color;
  int x;
  int y;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_291;
  string local_290;
  LogImage local_270;
  MessageBuilder local_1e0;
  undefined1 local_60 [8];
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  shadeFrequency;
  int rareCount;
  int rareThreshold;
  int numShadesRequired;
  bool isSingleSampleTarget;
  Surface *resultImage_local;
  MultisampleShadeCountRenderCase *this_local;
  
  _numShadesRequired = resultImage;
  resultImage_local = (Surface *)this;
  if (((this->super_MultisampleRenderCase).m_renderTarget == TARGET_DEFAULT) ||
     (local_651 = true, (this->super_MultisampleRenderCase).m_numRequestedSamples != 0)) {
    local_652 = false;
    if ((this->super_MultisampleRenderCase).m_renderTarget == TARGET_DEFAULT) {
      this_00 = gles31::Context::getRenderTarget
                          ((this->super_MultisampleRenderCase).super_TestCase.m_context);
      iVar2 = tcu::RenderTarget::getNumSamples(this_00);
      local_652 = iVar2 < 2;
    }
    local_651 = local_652;
  }
  rareThreshold._3_1_ = local_651;
  if (local_651 == false) {
    local_658 = (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  }
  else {
    local_658 = 2;
  }
  rareCount = local_658;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         *)local_60);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"ResultImage",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Result Image",&local_2c9)
  ;
  tcu::Surface::getAccess((ConstPixelBufferAccess *)&x,_numShadesRequired);
  tcu::LogImage::LogImage
            (&local_270,&local_290,&local_2c8,(ConstPixelBufferAccess *)&x,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_270);
  tcu::TestLog::operator<<(&local_1e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1e0,(char (*) [32])"Verifying image has (at least) ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&rareCount);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])" different shades.\n");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [89])
                             "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  tcu::LogImage::~LogImage(&local_270);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  for (color.m_value = 0; (int)color.m_value < 0x80; color.m_value = color.m_value + 1) {
    for (packed = 0; (int)packed < 0x80; packed = packed + 1) {
      local_304 = tcu::Surface::getPixel(_numShadesRequired,packed,color.m_value);
      iVar2 = tcu::RGBA::getRed(&local_304);
      iVar3 = tcu::RGBA::getGreen(&local_304);
      iVar4 = tcu::RGBA::getGreen(&local_304);
      local_308 = iVar2 + iVar3 * 0x100 + iVar4 * 0x10000;
      if (packed != color.m_value) {
        local_310._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::find((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                     *)local_60,&local_308);
        it._M_node = (_Base_ptr)
                     std::
                     map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                     ::end((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                            *)local_60);
        bVar1 = std::operator==(&local_310,(_Self *)&it);
        if (bVar1) {
          pmVar7 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)local_60,&local_308);
          *pmVar7 = 1;
        }
        else {
          pmVar7 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)local_60,&local_308);
          iVar2 = *pmVar7;
          pmVar7 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)local_60,&local_308);
          *pmVar7 = iVar2 + 1;
        }
      }
    }
  }
  local_328._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
       ::begin((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)local_60);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_>::_Rb_tree_const_iterator
            (&local_320,&local_328);
  while( true ) {
    local_338._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         ::end((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)local_60);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_>::_Rb_tree_const_iterator
              (&local_330,&local_338);
    bVar1 = std::operator!=(&local_320,&local_330);
    if (!bVar1) break;
    ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_>::operator->
                       (&local_320);
    if (ppVar8->second < 100) {
      shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_>::operator++(&local_320);
  }
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_4b8,(char (*) [7])0x2c2d50c);
  sVar9 = std::
          map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::size((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)local_60);
  local_4bc = (int)sVar9;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4bc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])" different shades.\n");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tRare (less than ");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(int *)((long)&shadeFrequency._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count + 4));
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])" pixels): ");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(int *)&shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])"\tCommon: ");
  sVar9 = std::
          map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::size((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)local_60);
  local_4c0 = (int)sVar9 - (int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4c0);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b8);
  sVar9 = std::
          map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::size((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)local_60);
  this_local._7_1_ = rareCount <= (int)sVar9;
  if (!(bool)this_local._7_1_) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_640,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_640,(char (*) [27])"Image verification failed.")
    ;
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_640);
  }
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MultisampleShadeCountRenderCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool				isSingleSampleTarget	= (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);
	const int				numShadesRequired		= (isSingleSampleTarget) ? (2) : (m_numTargetSamples + 1);
	const int				rareThreshold			= 100;
	int						rareCount				= 0;
	std::map<deUint32, int>	shadeFrequency;

	m_testCtx.getLog()
		<< tcu::TestLog::Image("ResultImage", "Result Image", resultImage.getAccess())
		<< tcu::TestLog::Message
		<< "Verifying image has (at least) " << numShadesRequired << " different shades.\n"
		<< "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
		<< tcu::TestLog::EndMessage;

	for (int y = 0; y < RENDER_SIZE; ++y)
	for (int x = 0; x < RENDER_SIZE; ++x)
	{
		const tcu::RGBA	color	= resultImage.getPixel(x, y);
		const deUint32	packed	= ((deUint32)color.getRed()) + ((deUint32)color.getGreen() << 8) + ((deUint32)color.getGreen() << 16);

		// on the triangle edge, skip
		if (x == y)
			continue;

		if (shadeFrequency.find(packed) == shadeFrequency.end())
			shadeFrequency[packed] = 1;
		else
			shadeFrequency[packed] = shadeFrequency[packed] + 1;
	}

	for (std::map<deUint32, int>::const_iterator it = shadeFrequency.begin(); it != shadeFrequency.end(); ++it)
		if (it->second < rareThreshold)
			rareCount++;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found " << (int)shadeFrequency.size() << " different shades.\n"
		<< "\tRare (less than " << rareThreshold << " pixels): " << rareCount << "\n"
		<< "\tCommon: " << (int)shadeFrequency.size() - rareCount << "\n"
		<< tcu::TestLog::EndMessage;

	if ((int)shadeFrequency.size() < numShadesRequired)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}